

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossiblePortConnection(TokenKind kind)

{
  short in_DI;
  bool local_1;
  
  if ((in_DI == 0x11) || (in_DI == 0x18 || in_DI == 0x19)) {
    local_1 = true;
  }
  else {
    local_1 = isPossibleArgument(Unknown);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossiblePortConnection(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::Dot:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleArgument(kind);
    }
}